

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O0

FedObject * __thiscall MasterObjectHolder::findFed(MasterObjectHolder *this,string_view fedName)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  bool bVar1;
  pointer pFVar2;
  element_type *this_00;
  char *in_RDX;
  size_t in_RSI;
  __sv_type __y;
  unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_> *fed;
  iterator __end1;
  iterator __begin1;
  deque<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>,_std::allocator<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_>_>
  *__range1;
  handle handle;
  guarded<std::deque<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>,_std::allocator<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_>_>,_std::mutex>
  *in_stack_ffffffffffffff38;
  _Deque_iterator<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>,_std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_&,_std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_*>
  *in_stack_ffffffffffffff40;
  size_t sVar3;
  char *pcVar4;
  _Self local_80;
  _Self local_60;
  deque<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>,_std::allocator<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_>_>
  *local_40;
  lock_handle<std::deque<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>,_std::allocator<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_>_>,_std::mutex>
  local_38;
  size_t local_18;
  char *pcStack_10;
  pointer local_8;
  
  local_18 = in_RSI;
  pcStack_10 = in_RDX;
  gmlc::libguarded::
  guarded<std::deque<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>,_std::allocator<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_>_>,_std::mutex>
  ::lock(in_stack_ffffffffffffff38);
  local_40 = gmlc::libguarded::
             lock_handle<std::deque<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>,_std::allocator<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_>_>,_std::mutex>
             ::operator*(&local_38);
  std::
  deque<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>,_std::allocator<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_>_>
  ::begin(&in_stack_ffffffffffffff38->m_obj);
  std::
  deque<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>,_std::allocator<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_>_>
  ::end(&in_stack_ffffffffffffff38->m_obj);
  do {
    bVar1 = std::operator==(&local_60,&local_80);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      local_8 = (pointer)0x0;
LAB_001a4104:
      gmlc::libguarded::
      lock_handle<std::deque<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>,_std::allocator<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_>_>,_std::mutex>
      ::~lock_handle((lock_handle<std::deque<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>,_std::allocator<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_>_>,_std::mutex>
                      *)0x1a4111);
      return local_8;
    }
    std::
    _Deque_iterator<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>,_std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_&,_std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_*>
    ::operator*(&local_60);
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_> *)
                       0x1a4017);
    if (bVar1) {
      pFVar2 = std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>::
               operator->((unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_> *)
                          0x1a402a);
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&pFVar2->fedptr);
      if (bVar1) {
        sVar3 = local_18;
        pcVar4 = pcStack_10;
        std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>::operator->
                  ((unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_> *)
                   0x1a4056);
        this_00 = std::
                  __shared_ptr_access<helics::Federate,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<helics::Federate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x1a4062);
        in_stack_ffffffffffffff40 =
             (_Deque_iterator<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>,_std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_&,_std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_*>
              *)helics::Federate::getName_abi_cxx11_(this_00);
        __y = std::__cxx11::string::operator_cast_to_basic_string_view
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffff40);
        __x._M_str = pcVar4;
        __x._M_len = sVar3;
        bVar1 = std::operator==(__x,__y);
        if (bVar1) {
          local_8 = std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>::get
                              ((unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>
                                *)in_stack_ffffffffffffff40);
          goto LAB_001a4104;
        }
      }
    }
    std::
    _Deque_iterator<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>,_std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_&,_std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_*>
    ::operator++(in_stack_ffffffffffffff40);
  } while( true );
}

Assistant:

helics::FedObject* MasterObjectHolder::findFed(std::string_view fedName)
{
    auto handle = feds.lock();
    for (auto& fed : (*handle)) {
        if ((fed) && (fed->fedptr)) {
            if (fed->fedptr->getName() == fedName) {
                return fed.get();
            }
        }
    }
    return nullptr;
}